

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

TPZSkylMatrix<std::complex<long_double>_> * __thiscall
TPZSkylMatrix<std::complex<long_double>_>::operator-
          (TPZSkylMatrix<std::complex<long_double>_> *__return_storage_ptr__,
          TPZSkylMatrix<std::complex<long_double>_> *this,
          TPZSkylMatrix<std::complex<long_double>_> *A)

{
  longdouble lVar1;
  complex<long_double> *pcVar2;
  complex<long_double> *pcVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar6;
  long lVar7;
  bool bVar8;
  
  iVar4 = (*(this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable
            ._vptr_TPZSavable[0xc])(this);
  iVar5 = (*(A->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(A);
  if (CONCAT44(extraout_var,iVar4) != CONCAT44(extraout_var_00,iVar5)) {
    TPZMatrix<std::complex<long_double>_>::Error
              ("TPZSkylMatrix<TVar> TPZSkylMatrix<std::complex<long double>>::operator-(const TPZSkylMatrix<TVar> &) const [TVar = std::complex<long double>]"
               ,"<incompatible dimensions>");
  }
  (*(this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0x4a])(this,this,A);
  TPZSkylMatrix(__return_storage_ptr__,this);
  lVar7 = (__return_storage_ptr__->fStorage).fNElements;
  lVar6 = 0;
  if (0 < lVar7) {
    lVar6 = lVar7;
  }
  lVar7 = 0x10;
  while (bVar8 = lVar6 != 0, lVar6 = lVar6 + -1, bVar8) {
    pcVar2 = (A->fStorage).fStore;
    pcVar3 = (__return_storage_ptr__->fStorage).fStore;
    lVar1 = *(longdouble *)(pcVar2->_M_value + lVar7);
    *(longdouble *)(pcVar3->_M_value + lVar7 + -0x10) =
         *(longdouble *)(pcVar3->_M_value + lVar7 + -0x10) -
         *(longdouble *)(pcVar2->_M_value + lVar7 + -0x10);
    *(longdouble *)(pcVar3->_M_value + lVar7) = *(longdouble *)(pcVar3->_M_value + lVar7) - lVar1;
    lVar7 = lVar7 + 0x20;
  }
  return __return_storage_ptr__;
}

Assistant:

TPZSkylMatrix<TVar>
TPZSkylMatrix<TVar>::operator-(const TPZSkylMatrix<TVar> &A ) const
{
  if ( this->Dim() != A.Dim() )
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"<incompatible dimensions>" );
  CheckTypeCompatibility(this,&A);
	auto res(*this);
  const auto size = res.fStorage.size();
  for(auto i = 0; i < size; i++) res.fStorage[i] -= A.fStorage[i];
	return res;
}